

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

_Bool prof_dump_printf(_Bool propagate_err,char *format,...)

{
  char in_AL;
  _Bool _Var1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  byte in_DIL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char buf [128];
  va_list ap;
  _Bool ret;
  __va_list_tag *in_stack_00000728;
  char *in_stack_00000730;
  size_t in_stack_00000738;
  char *in_stack_00000740;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  char local_b8 [128];
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_10;
  byte local_1;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_1 = in_DIL & 1;
  local_28 = local_168;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_158 = in_RDX;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  local_10 = in_RSI;
  malloc_vsnprintf(in_stack_00000740,in_stack_00000738,in_stack_00000730,in_stack_00000728);
  _Var1 = prof_dump_write((_Bool)(local_1 & 1),local_b8);
  return _Var1;
}

Assistant:

static bool
prof_dump_printf(bool propagate_err, const char *format, ...) {
	bool ret;
	va_list ap;
	char buf[PROF_PRINTF_BUFSIZE];

	va_start(ap, format);
	malloc_vsnprintf(buf, sizeof(buf), format, ap);
	va_end(ap);
	ret = prof_dump_write(propagate_err, buf);

	return ret;
}